

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexSeparableFilter::applyToCornerFace
          (PtexSeparableFilter *this,PtexSeparableKernel *k,FaceInfo *f,int eid,int cfid,
          FaceInfo *cf,int ceid)

{
  byte bVar1;
  byte bVar2;
  undefined4 in_ECX;
  FaceInfo *in_RDX;
  PtexSeparableKernel *in_RSI;
  PtexSeparableFilter *in_RDI;
  int in_R8D;
  FaceInfo *in_R9;
  bool cfIsSubface;
  bool fIsSubface;
  FaceInfo *in_stack_000000d8;
  int in_stack_000000e4;
  PtexSeparableKernel *in_stack_000000e8;
  PtexSeparableFilter *in_stack_000000f0;
  undefined6 in_stack_ffffffffffffffd0;
  int eid_00;
  
  bVar1 = FaceInfo::isSubface(in_RDX);
  bVar2 = FaceInfo::isSubface(in_R9);
  if ((bVar1 & 1) != bVar2) {
    eid_00 = (int)((ulong)in_R9 >> 0x20);
    if ((bool)bVar2) {
      PtexSeparableKernel::adjustMainToSubface
                ((PtexSeparableKernel *)CONCAT44(in_ECX,in_R8D),eid_00);
    }
    else {
      PtexSeparableKernel::adjustSubfaceToMain
                ((PtexSeparableKernel *)CONCAT44(in_ECX,in_R8D),eid_00);
    }
  }
  PtexSeparableKernel::rotate
            ((PtexSeparableKernel *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_ffffffffffffffd0)),
             (int)((ulong)in_RDI >> 0x20));
  if ((bVar2 & 1) == 0) {
    apply(in_RDI,in_RSI,in_R8D,in_R9);
  }
  else {
    splitAndApply(in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000d8);
  }
  return;
}

Assistant:

void PtexSeparableFilter::applyToCornerFace(PtexSeparableKernel& k, const Ptex::FaceInfo& f, int eid,
                                            int cfid, const Ptex::FaceInfo& cf, int ceid)
{
    // adjust uv coord and res for face/subface boundary
    bool fIsSubface = f.isSubface(), cfIsSubface = cf.isSubface();
    if (fIsSubface != cfIsSubface) {
        if (cfIsSubface) k.adjustMainToSubface(eid + 3);
        else k.adjustSubfaceToMain(eid + 3);
    }

    // rotate and apply (resplit if going to a subface)
    k.rotate(eid - ceid + 2);
    if (cfIsSubface) splitAndApply(k, cfid, cf);
    else apply(k, cfid, cf);
}